

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.h
# Opt level: O1

size_type __thiscall bitmap::Bitmap::Deserialize(Bitmap *this,istream *in)

{
  long lVar1;
  data_type *pdVar2;
  size_type sVar3;
  long lVar4;
  ulong uVar5;
  
  sVar3 = 8;
  std::istream::read((char *)in,(long)&this->size_);
  pdVar2 = (data_type *)
           operator_new__((((this->size_ >> 6) + 1) - (ulong)((this->size_ & 0x3f) == 0)) * 8);
  this->data_ = pdVar2;
  if ((this->size_ & 0x3f) != 0 || this->size_ >> 6 != 0) {
    uVar5 = 0;
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      std::istream::read((char *)in,(long)this->data_ + lVar4);
      uVar5 = uVar5 + 1;
      lVar1 = lVar4 + 8;
    } while (uVar5 < ((this->size_ >> 6) + 1) - (ulong)((this->size_ & 0x3f) == 0));
    sVar3 = lVar4 + 0x10;
  }
  return sVar3;
}

Assistant:

Bitmap::size_type Bitmap::Deserialize(std::istream& in) {
  size_t in_size = 0;

  in.read(reinterpret_cast<char *>(&size_), sizeof(uint64_t));
  in_size += sizeof(uint64_t);

  data_ = new uint64_t[BITS2BLOCKS(size_)];
  for (uint64_t i = 0; i < BITS2BLOCKS(size_); i++) {
    in.read(reinterpret_cast<char *>(&data_[i]), sizeof(uint64_t));
    in_size += sizeof(uint64_t);
  }

  return in_size;
}